

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O2

Aig_Man_t * Saig_ManCexMinDupWithCubes(Aig_Man_t *pAig,Vec_Vec_t *vReg2Value)

{
  char *__s;
  int iVar1;
  int iVar2;
  uint uVar3;
  Aig_Man_t *p;
  size_t sVar4;
  char *__dest;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Vec_Int_t *p_00;
  ulong uVar8;
  Aig_Obj_t *p1;
  int iVar9;
  int iVar10;
  
  if (pAig->nConstrs != 0) {
    __assert_fail("pAig->nConstrs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                  ,500,"Aig_Man_t *Saig_ManCexMinDupWithCubes(Aig_Man_t *, Vec_Vec_t *)");
  }
  iVar9 = pAig->nObjs[6];
  iVar10 = pAig->nObjs[5];
  iVar1 = Vec_VecSizeSize(vReg2Value);
  p = Aig_ManStart(iVar9 + iVar10 + iVar1 + vReg2Value->nSize);
  __s = pAig->pName;
  iVar9 = 0;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar4 = strlen(__s);
    __dest = (char *)malloc(sVar4 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  while( true ) {
    if (pAig->vCis->nSize <= iVar9) break;
    pvVar5 = Vec_PtrEntry(pAig->vCis,iVar9);
    pAVar6 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar6;
    iVar9 = iVar9 + 1;
  }
  for (iVar9 = 0; iVar9 < pAig->vObjs->nSize; iVar9 = iVar9 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar9);
    if ((pAVar6 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar6->field_0x18 & 7) - 7)) {
      pAVar7 = Aig_ObjChild0Copy(pAVar6);
      if (((ulong)pAVar6 & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
      }
      uVar8 = (ulong)pAVar6->pFanin1 & 0xfffffffffffffffe;
      if (uVar8 == 0) {
        p1 = (Aig_Obj_t *)0x0;
      }
      else {
        p1 = (Aig_Obj_t *)((ulong)((uint)pAVar6->pFanin1 & 1) ^ *(ulong *)(uVar8 + 0x28));
      }
      pAVar7 = Aig_And(p,pAVar7,p1);
      (pAVar6->field_5).pData = pAVar7;
    }
  }
  iVar9 = 0;
  do {
    if (vReg2Value->nSize <= iVar9) {
      for (iVar9 = 0; iVar9 < pAig->nRegs; iVar9 = iVar9 + 1) {
        pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar9);
        pAVar6 = Aig_ObjChild0Copy(pAVar6);
        Aig_ObjCreateCo(p,pAVar6);
      }
      Aig_ManCleanup(p);
      Aig_ManSetRegNum(p,pAig->nRegs);
      return p;
    }
    p_00 = Vec_VecEntryInt(vReg2Value,iVar9);
    if (iVar9 != 0) {
      pAVar6 = p->pConst1;
      for (iVar10 = 0; iVar10 < p_00->nSize; iVar10 = iVar10 + 1) {
        iVar1 = Vec_IntEntry(p_00,iVar10);
        if ((iVar1 < 0) || (pAig->nRegs * 2 <= iVar1)) {
          __assert_fail("Lit >= 0 && Lit < 2 * Aig_ManRegNum(pAig)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                        ,0x208,"Aig_Man_t *Saig_ManCexMinDupWithCubes(Aig_Man_t *, Vec_Vec_t *)");
        }
        iVar2 = Abc_Lit2Var(iVar1);
        pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar2 + pAig->nTruePos);
        pAVar7 = Aig_ObjChild0Copy(pAVar7);
        uVar3 = Abc_LitIsCompl(iVar1);
        pAVar6 = Aig_And(p,pAVar6,(Aig_Obj_t *)((ulong)uVar3 ^ (ulong)pAVar7));
      }
      Aig_ObjCreateCo(p,pAVar6);
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Saig_ManCexMinDupWithCubes( Aig_Man_t * pAig, Vec_Vec_t * vReg2Value )
{
    Vec_Int_t * vLevel;
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pObj, * pMiter;
    int i, k, Lit;
    assert( pAig->nConstrs == 0 );
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) + Vec_VecSizeSize(vReg2Value) + Vec_VecSize(vReg2Value) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create POs for cubes
    Vec_VecForEachLevelInt( vReg2Value, vLevel, i )
    {
        if ( i == 0 )
            continue;
        pMiter = Aig_ManConst1( pAigNew );
        Vec_IntForEachEntry( vLevel, Lit, k )
        {
            assert( Lit >= 0 && Lit < 2 * Aig_ManRegNum(pAig) );
            pObj = Saig_ManLi( pAig, Abc_Lit2Var(Lit) );
            pMiter = Aig_And( pAigNew, pMiter, Aig_NotCond(Aig_ObjChild0Copy(pObj), Abc_LitIsCompl(Lit)) );
        }
        Aig_ObjCreateCo( pAigNew, pMiter );
    }
    // transfer to register outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    // finalize
    Aig_ManCleanup( pAigNew );
    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    return pAigNew;
}